

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::detail::ResultBuilder::ResultBuilder
          (ResultBuilder *this,Enum at,char *file,int line,char *expr,char *exception_type,
          Contains *exception_string)

{
  char *__dest;
  anon_union_24_2_13149d16_for_String_3 local_78;
  char *local_60;
  anon_union_24_2_13149d16_for_String_3 local_58;
  undefined1 local_40;
  
  if ((exception_string->string).field_0.buf[0x17] < '\0') {
    local_60 = exception_type;
    __dest = String::allocate((String *)&local_78.data,(exception_string->string).field_0.data.size)
    ;
    memcpy(__dest,(exception_string->string).field_0.data.ptr,
           (ulong)(exception_string->string).field_0.data.size);
    exception_type = local_60;
  }
  else {
    local_78._16_8_ = *(long *)((long)&(exception_string->string).field_0 + 0x10);
    local_78.data.ptr = (exception_string->string).field_0.data.ptr;
    local_78._8_8_ = *(undefined8 *)((long)&(exception_string->string).field_0 + 8);
  }
  local_58._16_8_ = local_78._16_8_;
  local_58.data.ptr = local_78.data.ptr;
  local_58._8_8_ = local_78._8_8_;
  local_78.data.ptr = (char *)((ulong)local_78.data.ptr & 0xffffffffffffff00);
  local_78.buf[0x17] = 0x17;
  local_40 = 1;
  AssertData::AssertData
            (&this->super_AssertData,at,file,line,expr,exception_type,
             (StringContains *)&local_58.data);
  if (((long)local_58._16_8_ < 0) && (local_58.data.ptr != (char *)0x0)) {
    operator_delete__(local_58.data.ptr);
  }
  if (((long)local_78._16_8_ < 0) && (local_78.data.ptr != (char *)0x0)) {
    operator_delete__(local_78.data.ptr);
  }
  return;
}

Assistant:

ResultBuilder::ResultBuilder(assertType::Enum at, const char* file, int line, const char* expr,
        const char* exception_type, const Contains& exception_string)
        : AssertData(at, file, line, expr, exception_type, exception_string) { }